

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O1

void __thiscall
smf::MidiMessage::makeMts2_KeyTuningsBySemitone
          (MidiMessage *this,int key,double semitone,int program)

{
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> semimap;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_38;
  pair<int,_double> local_20;
  
  local_38.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20.first = key;
  local_20.second = semitone;
  std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
  _M_realloc_insert<std::pair<int,double>>
            ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&local_38,
             (iterator)0x0,&local_20);
  makeMts2_KeyTuningsBySemitone(this,&local_38,program);
  if (local_38.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MidiMessage::makeMts2_KeyTuningsBySemitone(int key, double semitone, int program) {
	std::vector<std::pair<int, double>> semimap;
	semimap.push_back(std::make_pair(key, semitone));
	this->makeMts2_KeyTuningsBySemitone(semimap, program);
}